

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall double_conversion::Bignum::SubtractTimes(Bignum *this,Bignum *other,int factor)

{
  short sVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  short sVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  if (factor < 3) {
    if (0 < factor) {
      do {
        SubtractBignum(this,other);
        factor = factor + -1;
      } while (factor != 0);
    }
  }
  else {
    sVar6 = other->exponent_;
    sVar1 = this->exponent_;
    sVar2 = other->used_bigits_;
    if (sVar2 < 1) {
      uVar9 = 0;
    }
    else {
      lVar4 = (long)(int)sVar6 * 4 + (long)(int)sVar1 * -4 + 4;
      uVar8 = 0;
      uVar9 = 0;
      do {
        uVar5 = (ulong)uVar9 + (ulong)other->bigits_buffer_[uVar8] * (ulong)(uint)factor;
        uVar9 = *(int *)((long)this + uVar8 * 4 + lVar4) - ((uint)uVar5 & 0xfffffff);
        *(uint *)((long)this + uVar8 * 4 + lVar4) = uVar9 & 0xfffffff;
        uVar9 = (int)(uVar5 >> 0x1c) - ((int)uVar9 >> 0x1f);
        uVar8 = uVar8 + 1;
      } while ((uint)(int)sVar2 != uVar8);
    }
    iVar3 = ((int)sVar6 - (int)sVar1) + (int)sVar2;
    sVar6 = this->used_bigits_;
    uVar7 = (uint)sVar6;
    if (iVar3 < (int)uVar7) {
      lVar4 = (long)iVar3;
      do {
        if (uVar9 == 0) {
          return;
        }
        uVar9 = this->bigits_buffer_[lVar4] - uVar9;
        this->bigits_buffer_[lVar4] = uVar9 & 0xfffffff;
        uVar9 = uVar9 >> 0x1f;
        lVar4 = lVar4 + 1;
      } while (lVar4 < (int)uVar7);
    }
    if (sVar6 < 1) {
      if (sVar6 != 0) {
        return;
      }
    }
    else {
      do {
        if (this->bigits_buffer_[(uVar7 & 0xffff) - 1] != 0) {
          return;
        }
        this->used_bigits_ = (int16_t)(uVar7 - 1);
        sVar6 = (short)uVar7;
        uVar7 = uVar7 - 1;
      } while (1 < sVar6);
    }
    this->exponent_ = 0;
  }
  return;
}

Assistant:

void Bignum::SubtractTimes(const Bignum& other, const int factor) {
  DOUBLE_CONVERSION_ASSERT(exponent_ <= other.exponent_);
  if (factor < 3) {
    for (int i = 0; i < factor; ++i) {
      SubtractBignum(other);
    }
    return;
  }
  Chunk borrow = 0;
  const int exponent_diff = other.exponent_ - exponent_;
  for (int i = 0; i < other.used_bigits_; ++i) {
    const DoubleChunk product = static_cast<DoubleChunk>(factor) * other.RawBigit(i);
    const DoubleChunk remove = borrow + product;
    const Chunk difference = RawBigit(i + exponent_diff) - (remove & kBigitMask);
    RawBigit(i + exponent_diff) = difference & kBigitMask;
    borrow = static_cast<Chunk>((difference >> (kChunkSize - 1)) +
                                (remove >> kBigitSize));
  }
  for (int i = other.used_bigits_ + exponent_diff; i < used_bigits_; ++i) {
    if (borrow == 0) {
      return;
    }
    const Chunk difference = RawBigit(i) - borrow;
    RawBigit(i) = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  Clamp();
}